

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMergingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  char cVar1;
  char *pcVar2;
  string_view text;
  size_t sStack_20;
  
  cVar1 = google::protobuf::FieldDescriptor::has_presence();
  if (cVar1 == '\0') {
    pcVar2 = 
    "if (!other.get$capitalized_name$().isEmpty()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
    ;
    sStack_20 = 0x7a;
  }
  else {
    pcVar2 = 
    "if (other.has$capitalized_name$()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
    ;
    sStack_20 = 0x6f;
  }
  text._M_str = pcVar2;
  text._M_len = sStack_20;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    // Allow a slight breach of abstraction here in order to avoid forcing
    // all string fields to Strings when copying fields from a Message.
    printer->Print(variables_,
                   "if (other.has$capitalized_name$()) {\n"
                   "  $name$_ = other.$name$_;\n"
                   "  $set_has_field_bit_builder$\n"
                   "  $on_changed$\n"
                   "}\n");
  } else {
    printer->Print(variables_,
                   "if (!other.get$capitalized_name$().isEmpty()) {\n"
                   "  $name$_ = other.$name$_;\n"
                   "  $set_has_field_bit_builder$\n"
                   "  $on_changed$\n"
                   "}\n");
  }
}